

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

void __thiscall HighsMipSolverData::basisTransfer(HighsMipSolverData *this)

{
  int iVar1;
  HighsLp *pHVar2;
  pointer piVar3;
  pointer pHVar4;
  pointer pHVar5;
  size_type sVar6;
  size_type sVar7;
  value_type local_22;
  value_type local_21;
  
  if (this->mipsolver->rootbasis != (HighsBasis *)0x0) {
    pHVar2 = this->mipsolver->model_;
    sVar7 = (size_type)pHVar2->num_row_;
    iVar1 = pHVar2->num_col_;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::_M_fill_assign
              (&(this->firstrootbasis).col_status,(long)iVar1,&local_21);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::_M_fill_assign
              (&(this->firstrootbasis).row_status,sVar7,&local_22);
    (this->firstrootbasis).valid = true;
    (this->firstrootbasis).alien = true;
    (this->firstrootbasis).useful = true;
    if (0 < (long)sVar7) {
      piVar3 = (this->postSolveStack).origRowIndex.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pHVar4 = (this->mipsolver->rootbasis->row_status).
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      pHVar5 = (this->firstrootbasis).row_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar6 = 0;
      do {
        pHVar5[sVar6] = pHVar4[piVar3[sVar6]];
        sVar6 = sVar6 + 1;
      } while (sVar7 != sVar6);
    }
    if (0 < iVar1) {
      piVar3 = (this->postSolveStack).origColIndex.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pHVar4 = (this->mipsolver->rootbasis->col_status).
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      pHVar5 = (this->firstrootbasis).col_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar7 = 0;
      do {
        pHVar5[sVar7] = pHVar4[piVar3[sVar7]];
        sVar7 = sVar7 + 1;
      } while ((long)iVar1 != sVar7);
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::basisTransfer() {
  // if a root basis is given, construct a basis for the root LP from
  // in the reduced problem space after presolving
  if (mipsolver.rootbasis) {
    const HighsInt numRow = mipsolver.numRow();
    const HighsInt numCol = mipsolver.numCol();
    firstrootbasis.col_status.assign(numCol, HighsBasisStatus::kNonbasic);
    firstrootbasis.row_status.assign(numRow, HighsBasisStatus::kNonbasic);
    firstrootbasis.valid = true;
    firstrootbasis.alien = true;
    firstrootbasis.useful = true;

    for (HighsInt i = 0; i < numRow; ++i) {
      HighsBasisStatus status =
          mipsolver.rootbasis->row_status[postSolveStack.getOrigRowIndex(i)];
      firstrootbasis.row_status[i] = status;
    }

    for (HighsInt i = 0; i < numCol; ++i) {
      HighsBasisStatus status =
          mipsolver.rootbasis->col_status[postSolveStack.getOrigColIndex(i)];
      firstrootbasis.col_status[i] = status;
    }
  }
}